

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O0

void idx2::InsertionSort<idx2::t2<unsigned_int,idx2::channel*>*>
               (t2<unsigned_int,_idx2::channel_*> *Beg,t2<unsigned_int,_idx2::channel_*> *End)

{
  channel *pcVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  t2<unsigned_int,_idx2::channel_*> *ptVar5;
  t2<unsigned_int,_idx2::channel_*> *ptVar6;
  t2<unsigned_int,_idx2::channel_*> *local_50;
  t2<unsigned_int,_idx2::channel_*> *It;
  t2<unsigned_int,_idx2::channel_*> *Pos;
  t2<unsigned_int,_idx2::channel_*> *Last;
  t2<unsigned_int,_idx2::channel_*> *End_local;
  t2<unsigned_int,_idx2::channel_*> *Beg_local;
  t2<unsigned_int,_idx2::channel_*> T;
  
  if (Beg != End) {
    for (Pos = Beg + 1; Pos != End; Pos = Pos + 1) {
      ptVar5 = BinarySearch<idx2::t2<unsigned_int,idx2::channel*>,idx2::t2<unsigned_int,idx2::channel*>*>
                         (Beg,Pos,Pos);
      for (local_50 = Pos; local_50 != ptVar5; local_50 = local_50 + -1) {
        ptVar6 = local_50 + -1;
        uVar3 = local_50->First;
        uVar4 = *(undefined4 *)&local_50->field_0x4;
        pcVar1 = local_50->Second;
        uVar2 = *(undefined4 *)&ptVar6->field_0x4;
        local_50->First = ptVar6->First;
        *(undefined4 *)&local_50->field_0x4 = uVar2;
        local_50->Second = local_50[-1].Second;
        ptVar6->First = uVar3;
        *(undefined4 *)&ptVar6->field_0x4 = uVar4;
        local_50[-1].Second = pcVar1;
      }
    }
  }
  return;
}

Assistant:

void
InsertionSort(i Beg, i End)
{
  if (Beg == End)
    return;
  i Last = Beg + 1;
  while (Last != End)
  {
    i Pos = BinarySearch(Beg, Last, *Last);
    for (i It = Last; It != Pos; --It)
      Swap(It, It - 1);
    ++Last;
  }
}